

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O2

void __thiscall
Assimp::X3DExporter::AttrHelper_FloatToString(X3DExporter *this,float pValue,string *pTargetString)

{
  string sStack_38;
  
  std::__cxx11::to_string(&sStack_38,pValue);
  std::__cxx11::string::operator=((string *)pTargetString,(string *)&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  AttrHelper_CommaToPoint(this,pTargetString);
  return;
}

Assistant:

void X3DExporter::AttrHelper_FloatToString(const float pValue, std::string& pTargetString)
{
	pTargetString = to_string(pValue);
	AttrHelper_CommaToPoint(pTargetString);
}